

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O1

void YM2612_DacAndTimers_Update(ym2612_ *YM2612,DEV_SMPL **buffer,UINT32 length)

{
  UINT8 UVar1;
  byte bVar2;
  DEV_SMPL *pDVar3;
  DEV_SMPL *pDVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  
  if ((((YM2612->DAC != '\0') && (YM2612->DACdata != 0)) && (YM2612->DAC_Mute == '\0')) &&
     (length != 0)) {
    pDVar3 = *buffer;
    pDVar4 = buffer[1];
    UVar1 = YM2612->DAC_Highpass_Enable;
    uVar6 = 0;
    do {
      uVar8 = YM2612->DACdata;
      if (UVar1 != '\0') {
        iVar7 = uVar8 * 0x8000 - YM2612->dac_highpass;
        YM2612->dac_highpass = (iVar7 >> 9) + YM2612->dac_highpass;
        uVar8 = iVar7 >> 0xf;
      }
      pDVar3[uVar6] = pDVar3[uVar6] + (YM2612->CHANNEL[5].LEFT & uVar8);
      pDVar4[uVar6] = pDVar4[uVar6] + (uVar8 & YM2612->CHANNEL[5].RIGHT);
      uVar6 = uVar6 + 1;
    } while (length != uVar6);
  }
  iVar7 = length * YM2612->TimerBase;
  bVar2 = YM2612->Mode;
  if ((bVar2 & 1) != 0) {
    iVar5 = YM2612->TimerAcnt - iVar7;
    YM2612->TimerAcnt = iVar5;
    if (iVar5 < 1) {
      YM2612->Status = YM2612->Status | bVar2 >> 2 & 1;
      YM2612->TimerAcnt = iVar5 + YM2612->TimerAL;
      if ((char)bVar2 < '\0') {
        if (YM2612->CHANNEL[2].SLOT[0].Ecurp == 3) {
          YM2612->CHANNEL[2].SLOT[0].Fcnt = 0;
          iVar5 = YM2612->CHANNEL[2].SLOT[0].EincA;
          YM2612->CHANNEL[2].SLOT[0].Ecnt =
               YM2612->CHANNEL[2].SLOT[0].ChgEnM &
               DECAY_TO_ATTACK[ENV_TAB[*(short *)((long)&YM2612->CHANNEL[2].SLOT[0].Ecnt + 2)]];
          YM2612->CHANNEL[2].SLOT[0].ChgEnM = -1;
          YM2612->CHANNEL[2].SLOT[0].Einc = iVar5;
          YM2612->CHANNEL[2].SLOT[0].Ecmp = 0x10000000;
          YM2612->CHANNEL[2].SLOT[0].Ecurp = 0;
        }
        if (YM2612->CHANNEL[2].SLOT[1].Ecurp == 3) {
          YM2612->CHANNEL[2].SLOT[1].Fcnt = 0;
          iVar5 = YM2612->CHANNEL[2].SLOT[1].EincA;
          YM2612->CHANNEL[2].SLOT[1].Ecnt =
               YM2612->CHANNEL[2].SLOT[1].ChgEnM &
               DECAY_TO_ATTACK[ENV_TAB[*(short *)((long)&YM2612->CHANNEL[2].SLOT[1].Ecnt + 2)]];
          YM2612->CHANNEL[2].SLOT[1].ChgEnM = -1;
          YM2612->CHANNEL[2].SLOT[1].Einc = iVar5;
          YM2612->CHANNEL[2].SLOT[1].Ecmp = 0x10000000;
          YM2612->CHANNEL[2].SLOT[1].Ecurp = 0;
        }
        if (YM2612->CHANNEL[2].SLOT[2].Ecurp == 3) {
          YM2612->CHANNEL[2].SLOT[2].Fcnt = 0;
          iVar5 = YM2612->CHANNEL[2].SLOT[2].EincA;
          YM2612->CHANNEL[2].SLOT[2].Ecnt =
               YM2612->CHANNEL[2].SLOT[2].ChgEnM &
               DECAY_TO_ATTACK[ENV_TAB[*(short *)((long)&YM2612->CHANNEL[2].SLOT[2].Ecnt + 2)]];
          YM2612->CHANNEL[2].SLOT[2].ChgEnM = -1;
          YM2612->CHANNEL[2].SLOT[2].Einc = iVar5;
          YM2612->CHANNEL[2].SLOT[2].Ecmp = 0x10000000;
          YM2612->CHANNEL[2].SLOT[2].Ecurp = 0;
        }
        if (YM2612->CHANNEL[2].SLOT[3].Ecurp == 3) {
          YM2612->CHANNEL[2].SLOT[3].Fcnt = 0;
          iVar5 = YM2612->CHANNEL[2].SLOT[3].EincA;
          YM2612->CHANNEL[2].SLOT[3].Ecnt =
               YM2612->CHANNEL[2].SLOT[3].ChgEnM &
               DECAY_TO_ATTACK[ENV_TAB[*(short *)((long)&YM2612->CHANNEL[2].SLOT[3].Ecnt + 2)]];
          YM2612->CHANNEL[2].SLOT[3].ChgEnM = -1;
          YM2612->CHANNEL[2].SLOT[3].Einc = iVar5;
          YM2612->CHANNEL[2].SLOT[3].Ecmp = 0x10000000;
          YM2612->CHANNEL[2].SLOT[3].Ecurp = 0;
        }
      }
    }
  }
  if ((bVar2 & 2) != 0) {
    iVar7 = YM2612->TimerBcnt - iVar7;
    YM2612->TimerBcnt = iVar7;
    if (iVar7 < 1) {
      YM2612->Status = YM2612->Status | bVar2 >> 2 & 2;
      YM2612->TimerBcnt = iVar7 + YM2612->TimerBL;
    }
  }
  return;
}

Assistant:

void YM2612_DacAndTimers_Update(ym2612_ *YM2612, DEV_SMPL **buffer, UINT32 length)
{
  DEV_SMPL *bufL, *bufR;
  UINT32 i;

  if (YM2612->DAC && YM2612->DACdata && ! YM2612->DAC_Mute)
  {
    bufL = buffer[0];
    bufR = buffer[1];

    for (i = 0; i < length; i++)
    {
      int dac = YM2612->DACdata;
      if (YM2612->DAC_Highpass_Enable)
      {
        dac = (dac << highpass_fract) - YM2612->dac_highpass;
        YM2612->dac_highpass += dac >> highpass_shift;
        dac >>= highpass_fract;
      }
      bufL[i] += (dac & YM2612->CHANNEL[5].LEFT);
      bufR[i] += (dac & YM2612->CHANNEL[5].RIGHT);
    }
  }

  i = YM2612->TimerBase * length;

  if (YM2612->Mode & 1)             // Timer A ON ?
  {
//    if ((YM2612->TimerAcnt -= 14073) <= 0)   // 13879=NTSC (old: 14475=NTSC  14586=PAL)
    if ((YM2612->TimerAcnt -= i) <= 0)
    {
      YM2612->Status |= (YM2612->Mode & 0x04) >> 2;
      YM2612->TimerAcnt += YM2612->TimerAL;

#if YM_DEBUG_LEVEL > 0
      fprintf(debug_file, "Counter A overflow\n");
#endif

      if (YM2612->Mode & 0x80)
        CSM_Key_Control(YM2612);
    }
  }

  if (YM2612->Mode & 2)             // Timer B ON ?
  {
//    if ((YM2612->TimerBcnt -= 14073) <= 0)   // 13879=NTSC (old: 14475=NTSC  14586=PAL)
    if ((YM2612->TimerBcnt -= i) <= 0)
    {
      YM2612->Status |= (YM2612->Mode & 0x08) >> 2;
      YM2612->TimerBcnt += YM2612->TimerBL;

#if YM_DEBUG_LEVEL > 0
      fprintf(debug_file, "Counter B overflow\n");
#endif
    }
  }
}